

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedIndirectAddressingCase1CS::Run
          (AdvancedIndirectAddressingCase1CS *this)

{
  float fVar1;
  bool bVar2;
  GLuint GVar3;
  void *pvVar4;
  int local_440;
  int local_43c;
  int i_3;
  int i_2;
  GLfloat expected2 [96];
  GLfloat *out_data2;
  uint data_5 [4];
  uint data_4 [4];
  int local_280;
  int local_27c;
  int i_1;
  int i;
  GLfloat expected [96];
  GLfloat *out_data;
  uint data_3 [4];
  float data_2 [8];
  uint data_1 [4];
  float data [16];
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_cs;
  AdvancedIndirectAddressingCase1CS *pAStack_18;
  bool status;
  AdvancedIndirectAddressingCase1CS *this_local;
  
  glsl_cs._7_1_ = 1;
  local_28 = 
  "\nlayout(local_size_x = 2, local_size_y = 2) in;\nstruct Material {\n  vec3 color;\n};\nlayout(binding = 0, std430) buffer MaterialBuffer {\n  Material g_material[4];\n};\nlayout(binding = 1, std430) buffer MaterialIDBuffer {\n  uint g_material_id[4];\n};\nlayout(binding = 2, std430) buffer TransformBuffer {\n  vec2 translation[4];\n} g_transform;\nlayout(binding = 3, std430) buffer TransformIDBuffer {\n  uint g_transform_id[4];\n};\nlayout(binding = 4, std430) buffer OutputBuffer {\n  vec3 color[16];\n  vec2 pos[16];\n};\nvec2 g_in_position[4] = vec2[4](vec2(-0.4f, -0.4f), vec2(0.4f, -0.4f), vec2(-0.4f, 0.4f), vec2(0.4f, 0.4f));\nvoid main() {\n  uint mid = g_material_id[gl_WorkGroupID.x];\n  Material m = g_material[mid];\n  uint tid = g_transform_id[gl_WorkGroupID.x];\n  vec2 t = g_transform.translation[tid];\n  pos[gl_LocalInvocationIndex + gl_WorkGroupID.x * gl_WorkGroupSize.x * gl_WorkGroupSize.y] \n    = g_in_position[gl_LocalInvocationIndex] + t;\n  color[gl_LocalInvocationIndex + gl_WorkGroupID.x * gl_WorkGroupSize.x * gl_WorkGroupSize.y] = m.color;\n}"
  ;
  pAStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "\nlayout(local_size_x = 2, local_size_y = 2) in;\nstruct Material {\n  vec3 color;\n};\nlayout(binding = 0, std430) buffer MaterialBuffer {\n  Material g_material[4];\n};\nlayout(binding = 1, std430) buffer MaterialIDBuffer {\n  uint g_material_id[4];\n};\nlayout(binding = 2, std430) buffer TransformBuffer {\n  vec2 translation[4];\n} g_transform;\nlayout(binding = 3, std430) buffer TransformIDBuffer {\n  uint g_transform_id[4];\n};\nlayout(binding = 4, std430) buffer OutputBuffer {\n  vec3 color[16];\n  vec2 pos[16];\n};\nvec2 g_in_position[4] = vec2[4](vec2(-0.4f, -0.4f), vec2(0.4f, -0.4f), vec2(-0.4f, 0.4f), vec2(0.4f, 0.4f));\nvoid main() {\n  uint mid = g_material_id[gl_WorkGroupID.x];\n  Material m = g_material[mid];\n  uint tid = g_transform_id[gl_WorkGroupID.x];\n  vec2 t = g_transform.translation[tid];\n  pos[gl_LocalInvocationIndex + gl_WorkGroupID.x * gl_WorkGroupSize.x * gl_WorkGroupSize.y] \n    = g_in_position[gl_LocalInvocationIndex] + t;\n  color[gl_LocalInvocationIndex + gl_WorkGroupID.x * gl_WorkGroupSize.x * gl_WorkGroupSize.y] = m.color;\n}"
             ,&local_49);
  GVar3 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,&local_48);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (bVar2) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,this->m_storage_buffer);
    memcpy(data_1 + 2,&DAT_02a15e70,0x40);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer[0]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x40,data_1 + 2,0x88e8);
    data_2[6] = 2.8026e-45;
    data_2[7] = 4.2039e-45;
    data_1[0] = 0;
    data_1[1] = 2;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,1,this->m_storage_buffer[1]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x10,data_2 + 6,0x88e8);
    data_3[2] = 0xbf000000;
    data_3[3] = 0xbf000000;
    data_2[0] = 0.5;
    data_2[1] = -0.5;
    data_2[2] = -0.5;
    data_2[3] = 0.5;
    data_2[4] = 0.5;
    data_2[5] = 0.5;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,2,this->m_storage_buffer[2]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x20,data_3 + 2,0x88e8);
    out_data = (GLfloat *)0x100000003;
    data_3[0] = 0;
    data_3[1] = 2;
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,3,this->m_storage_buffer[3]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x10,&out_data,0x88e8);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,4,this->m_storage_buffer[4]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x180,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,4,1,1);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    pvVar4 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                         super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x180,1);
    if (pvVar4 == (void *)0x0) {
      this_local = (AdvancedIndirectAddressingCase1CS *)&DAT_ffffffffffffffff;
    }
    else {
      memcpy(&i_1,&DAT_02a15eb0,0x180);
      for (local_27c = 0; local_27c < 0x10; local_27c = local_27c + 1) {
        fVar1 = *(float *)((long)pvVar4 + (long)(local_27c << 2) * 4);
        if (((((fVar1 != (float)(&i_1)[local_27c << 2]) ||
              (NAN(fVar1) || NAN((float)(&i_1)[local_27c << 2]))) ||
             (fVar1 = *(float *)((long)pvVar4 + (long)(local_27c * 4 + 1) * 4),
             fVar1 != (float)(&i_1)[local_27c * 4 + 1])) ||
            ((NAN(fVar1) || NAN((float)(&i_1)[local_27c * 4 + 1]) ||
             (fVar1 = *(float *)((long)pvVar4 + (long)(local_27c * 4 + 2) * 4),
             fVar1 != (float)(&i_1)[local_27c * 4 + 2])))) ||
           (NAN(fVar1) || NAN((float)(&i_1)[local_27c * 4 + 2]))) {
          anon_unknown_0::Output
                    ("Received: %f, %f, %f, but expected: %f, %f, %f\n",
                     (double)*(float *)((long)pvVar4 + (long)(local_27c << 2) * 4),
                     SUB84((double)*(float *)((long)pvVar4 + (long)(local_27c * 4 + 1) * 4),0),
                     (double)*(float *)((long)pvVar4 + (long)(local_27c * 4 + 2) * 4),
                     (double)(float)(&i_1)[local_27c << 2],(double)(float)(&i_1)[local_27c * 4 + 1],
                     (double)(float)(&i_1)[local_27c * 4 + 2]);
          glsl_cs._7_1_ = 0;
        }
      }
      for (local_280 = 0x20; local_280 < 0x30; local_280 = local_280 + 1) {
        if ((1e-06 < ABS(*(float *)((long)pvVar4 + (long)(local_280 << 1) * 4) -
                         (float)(&i_1)[local_280 << 1])) ||
           (1e-06 < ABS(*(float *)((long)pvVar4 + (long)(local_280 * 2 + 1) * 4) -
                        (float)(&i_1)[local_280 * 2 + 1]))) {
          anon_unknown_0::Output
                    ("Received: %f, %f, but expected: %f, %f\n",
                     (double)*(float *)((long)pvVar4 + (long)(local_280 << 1) * 4),
                     SUB84((double)*(float *)((long)pvVar4 + (long)(local_280 * 2 + 1) * 4),0),
                     (double)(float)(&i_1)[local_280 << 1],(double)(float)(&i_1)[local_280 * 2 + 1])
          ;
          glsl_cs._7_1_ = 0;
        }
      }
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2);
      data_5[2] = 3;
      data_5[3] = 2;
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferSubData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,0x10,data_5 + 2);
      out_data2 = (GLfloat *)0x100000000;
      data_5[0] = 2;
      data_5[1] = 3;
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[3]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x10,&out_data2,0x88e8);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,4,1,1);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      pvVar4 = glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                           super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x180,1);
      if (pvVar4 == (void *)0x0) {
        this_local = (AdvancedIndirectAddressingCase1CS *)&DAT_ffffffffffffffff;
      }
      else {
        memcpy(&i_3,&DAT_02a16030,0x180);
        for (local_43c = 0; local_43c < 0x10; local_43c = local_43c + 1) {
          fVar1 = *(float *)((long)pvVar4 + (long)(local_43c << 2) * 4);
          if ((((fVar1 != (float)(&i_3)[local_43c << 2]) ||
               (NAN(fVar1) || NAN((float)(&i_3)[local_43c << 2]))) ||
              (fVar1 = *(float *)((long)pvVar4 + (long)(local_43c * 4 + 1) * 4),
              fVar1 != (float)(&i_3)[local_43c * 4 + 1])) ||
             (((NAN(fVar1) || NAN((float)(&i_3)[local_43c * 4 + 1]) ||
               (fVar1 = *(float *)((long)pvVar4 + (long)(local_43c * 4 + 2) * 4),
               fVar1 != (float)(&i_3)[local_43c * 4 + 2])) ||
              (NAN(fVar1) || NAN((float)(&i_3)[local_43c * 4 + 2]))))) {
            anon_unknown_0::Output
                      ("Received: %f, %f, %f, but expected: %f, %f, %f\n",
                       (double)*(float *)((long)pvVar4 + (long)(local_43c << 2) * 4),
                       SUB84((double)*(float *)((long)pvVar4 + (long)(local_43c * 4 + 1) * 4),0),
                       (double)*(float *)((long)pvVar4 + (long)(local_43c * 4 + 2) * 4),
                       (double)(float)(&i_3)[local_43c << 2],
                       (double)(float)(&i_3)[local_43c * 4 + 1],
                       (double)(float)(&i_3)[local_43c * 4 + 2]);
            glsl_cs._7_1_ = 0;
          }
        }
        for (local_440 = 0x20; local_440 < 0x30; local_440 = local_440 + 1) {
          if ((1e-06 < ABS(*(float *)((long)pvVar4 + (long)(local_440 << 1) * 4) -
                           (float)(&i_3)[local_440 << 1])) ||
             (1e-06 < ABS(*(float *)((long)pvVar4 + (long)(local_440 * 2 + 1) * 4) -
                          (float)(&i_3)[local_440 * 2 + 1]))) {
            anon_unknown_0::Output
                      ("Received: %f, %f, but expected: %f, %f\n",
                       (double)*(float *)((long)pvVar4 + (long)(local_440 << 1) * 4),
                       SUB84((double)*(float *)((long)pvVar4 + (long)(local_440 * 2 + 1) * 4),0),
                       (double)(float)(&i_3)[local_440 << 1],
                       (double)(float)(&i_3)[local_440 * 2 + 1]);
            glsl_cs._7_1_ = 0;
          }
        }
        if ((glsl_cs._7_1_ & 1) == 0) {
          this_local = (AdvancedIndirectAddressingCase1CS *)&DAT_ffffffffffffffff;
        }
        else {
          this_local = (AdvancedIndirectAddressingCase1CS *)0x0;
        }
      }
    }
  }
  else {
    this_local = (AdvancedIndirectAddressingCase1CS *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		bool status = true;

		const char* const glsl_cs =
			NL "layout(local_size_x = 2, local_size_y = 2) in;" NL "struct Material {" NL "  vec3 color;" NL "};" NL
			   "layout(binding = 0, std430) buffer MaterialBuffer {" NL "  Material g_material[4];" NL "};" NL
			   "layout(binding = 1, std430) buffer MaterialIDBuffer {" NL "  uint g_material_id[4];" NL "};" NL
			   "layout(binding = 2, std430) buffer TransformBuffer {" NL "  vec2 translation[4];" NL "} g_transform;" NL
			   "layout(binding = 3, std430) buffer TransformIDBuffer {" NL "  uint g_transform_id[4];" NL "};" NL
			   "layout(binding = 4, std430) buffer OutputBuffer {" NL "  vec3 color[16];" NL "  vec2 pos[16];" NL
			   "};" NL "vec2 g_in_position[4] = vec2[4](vec2(-0.4f, -0.4f), vec2(0.4f, -0.4f), vec2(-0.4f, 0.4f), "
			   "vec2(0.4f, 0.4f));" NL "void main() {" NL "  uint mid = g_material_id[gl_WorkGroupID.x];" NL
			   "  Material m = g_material[mid];" NL "  uint tid = g_transform_id[gl_WorkGroupID.x];" NL
			   "  vec2 t = g_transform.translation[tid];" NL
			   "  pos[gl_LocalInvocationIndex + gl_WorkGroupID.x * gl_WorkGroupSize.x * gl_WorkGroupSize.y] " NL
			   "    = g_in_position[gl_LocalInvocationIndex] + t;" NL "  color[gl_LocalInvocationIndex + "
			   "gl_WorkGroupID.x * gl_WorkGroupSize.x * "
			   "gl_WorkGroupSize.y] = m.color;" NL "}";

		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(5, m_storage_buffer);

		/* material buffer */
		{
			const float data[] = { 1.0f, 0.0f, 0.0f, 1.0f, 0.0f, 1.0f, 0.0f, 1.0f,
								   0.0f, 0.0f, 1.0f, 1.0f, 1.0f, 1.0f, 0.0f, 1.0f };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}
		/* material id buffer */
		{
			const unsigned int data[] = { 2, 3, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}
		/* transform buffer */
		{
			const float data[] = { -0.5f, -0.5f, 0.5f, -0.5f, -0.5f, 0.5f, 0.5f, 0.5f };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}
		/* transform id buffer */
		{
			const unsigned int data[] = { 3, 1, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 16 * 4 * 4 + 16 * 2 * 4, 0, GL_STATIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(4, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLfloat* out_data =
			(GLfloat*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16 * 4 * 4 + 16 * 2 * 4, GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		GLfloat expected[16 * 4 + 16 * 2] = {
			0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,
			1.0f,  0.0f,  1.0f,  1.0f,  0.0f,  0.0f,  1.0f,  1.0f,  0.0f,  0.0f,  1.0f,  1.0f,  0.0f,  0.0f,
			1.0f,  1.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,
			0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,
			0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.1f,  0.1f,  0.9f,  0.1f,  0.1f,  0.9f,
			0.9f,  0.9f,  0.1f,  -0.9f, 0.9f,  -0.9f, 0.1f,  -0.1f, 0.9f,  -0.1f, -0.9f, -0.9f, -0.1f, -0.9f,
			-0.9f, -0.1f, -0.1f, -0.1f, -0.9f, 0.1f,  -0.1f, 0.1f,  -0.9f, 0.9f,  -0.1f, 0.9f
		};
		for (int i = 0; i < 16; ++i)
		{
			if (out_data[i * 4 + 0] != expected[i * 4 + 0] || out_data[i * 4 + 1] != expected[i * 4 + 1] ||
				out_data[i * 4 + 2] != expected[i * 4 + 2])
			{
				Output("Received: %f, %f, %f, but expected: %f, %f, %f\n", out_data[i * 4 + 0], out_data[i * 4 + 1],
					   out_data[i * 4 + 2], expected[i * 4 + 0], expected[i * 4 + 1], expected[i * 4 + 2]);
				status = false;
			}
		}
		for (int i = 32; i < 32 + 16; ++i)
		{
			if (fabs(out_data[i * 2 + 0] - expected[i * 2 + 0]) > 1e-6 ||
				fabs(out_data[i * 2 + 1] - expected[i * 2 + 1]) > 1e-6)
			{
				Output("Received: %f, %f, but expected: %f, %f\n", out_data[i * 2 + 0], out_data[i * 2 + 1],
					   expected[i * 2 + 0], expected[i * 2 + 1]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		/* update material id buffer with BufferSubData */
		{
			const unsigned int data[] = { 3, 2, 1, 0 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
		}

		/* update transform id buffer with BufferData */
		{
			const unsigned int data[] = { 0, 1, 2, 3 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}

		glUseProgram(m_program);
		glDispatchCompute(4, 1, 1);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLfloat* out_data2 =
			(GLfloat*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16 * 4 * 4 + 16 * 2 * 4, GL_MAP_READ_BIT);
		if (!out_data2)
			return ERROR;
		GLfloat expected2[16 * 4 + 16 * 2] = {
			1.0f,  1.0f,  0.0f,  0.0f,  1.0f,  1.0f,  0.0f,  0.0f,  1.0f, 1.0f,  0.0f, 0.0f,  1.0f, 1.0f,  0.0f, 0.0f,
			0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f, 0.0f,  1.0f, 0.0f,  0.0f, 0.0f,  1.0f, 0.0f,
			0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f, 1.0f,  0.0f, 0.0f,  0.0f, 1.0f,  0.0f, 0.0f,
			1.0f,  0.0f,  0.0f,  0.0f,  1.0f,  0.0f,  0.0f,  0.0f,  1.0f, 0.0f,  0.0f, 0.0f,  1.0f, 0.0f,  0.0f, 0.0f,
			-0.9f, -0.9f, -0.1f, -0.9f, -0.9f, -0.1f, -0.1f, -0.1f, 0.1f, -0.9f, 0.9f, -0.9f, 0.1f, -0.1f, 0.9f, -0.1f,
			-0.9f, 0.1f,  -0.1f, 0.1f,  -0.9f, 0.9f,  -0.1f, 0.9f,  0.1f, 0.1f,  0.9f, 0.1f,  0.1f, 0.9f,  0.9f, 0.9f
		};
		for (int i = 0; i < 16; ++i)
		{
			if (out_data2[i * 4 + 0] != expected2[i * 4 + 0] || out_data2[i * 4 + 1] != expected2[i * 4 + 1] ||
				out_data2[i * 4 + 2] != expected2[i * 4 + 2])
			{
				Output("Received: %f, %f, %f, but expected: %f, %f, %f\n", out_data2[i * 4 + 0], out_data2[i * 4 + 1],
					   out_data2[i * 4 + 2], expected2[i * 4 + 0], expected2[i * 4 + 1], expected2[i * 4 + 2]);
				status = false;
			}
		}
		for (int i = 32; i < 32 + 16; ++i)
		{
			if (fabs(out_data2[i * 2 + 0] - expected2[i * 2 + 0]) > 1e-6 ||
				fabs(out_data2[i * 2 + 1] - expected2[i * 2 + 1]) > 1e-6)
			{
				Output("Received: %f, %f, but expected: %f, %f\n", out_data2[i * 2 + 0], out_data2[i * 2 + 1],
					   expected2[i * 2 + 0], expected2[i * 2 + 1]);
				status = false;
			}
		}

		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}